

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O2

void sznet::net::sockets::sz_toip(char *buf,size_t size,sockaddr *addr)

{
  int __af;
  long lStack_10;
  
  if (addr->sa_family == 10) {
    if (size < 0x2e) {
      __assert_fail("size >= INET6_ADDRSTRLEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SocketsOps.cpp"
                    ,0xe1,
                    "void sznet::net::sockets::sz_toip(char *, size_t, const struct sockaddr *)");
    }
    __af = 10;
    lStack_10 = 8;
  }
  else {
    if (addr->sa_family != 2) {
      return;
    }
    if (size < 0x10) {
      __assert_fail("size >= INET_ADDRSTRLEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SocketsOps.cpp"
                    ,0xdb,
                    "void sznet::net::sockets::sz_toip(char *, size_t, const struct sockaddr *)");
    }
    __af = 2;
    lStack_10 = 4;
  }
  inet_ntop(__af,addr->sa_data + lStack_10 + -2,buf,(socklen_t)size);
  return;
}

Assistant:

void sz_toip(char* buf, size_t size, const struct sockaddr* addr)
{
	if (addr->sa_family == AF_INET)
	{
		assert(size >= INET_ADDRSTRLEN);
		const struct sockaddr_in* addr4 = sz_sockaddrin_cast(addr);
		::inet_ntop(AF_INET, (void*)(&addr4->sin_addr), buf, size);
	}
	else if (addr->sa_family == AF_INET6)
	{
		assert(size >= INET6_ADDRSTRLEN);
		const struct sockaddr_in6* addr6 = sz_sockaddrin6_cast(addr);
		::inet_ntop(AF_INET6, (void*)(&addr6->sin6_addr), buf, size);
	}
}